

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int croaring_hardware_support(void)

{
  uint32_t uVar1;
  uint32_t uVar2;
  _Bool has_avx512;
  _Bool has_avx2;
  
  if (croaring_hardware_support::support == 0xfffffff) {
    uVar1 = croaring_detect_supported_architectures();
    uVar2 = croaring_detect_supported_architectures();
    croaring_hardware_support::support =
         ((uVar1 & 4) >> 2) + (uint)((CROARING_AVX512_REQUIRED & ~uVar2) == 0) * 2;
    LOCK();
    UNLOCK();
  }
  return croaring_hardware_support::support;
}

Assistant:

int croaring_hardware_support(void) {
    static
#if CROARING_ATOMIC_IMPL == CROARING_ATOMIC_IMPL_C
        _Atomic
#endif
        int support = 0xFFFFFFF;
    if (support == 0xFFFFFFF) {
        bool has_avx2 = (croaring_detect_supported_architectures() &
                         CROARING_AVX2) == CROARING_AVX2;
        bool has_avx512 = false;
#if CROARING_COMPILER_SUPPORTS_AVX512
        has_avx512 = (croaring_detect_supported_architectures() &
                      CROARING_AVX512_REQUIRED) == CROARING_AVX512_REQUIRED;
#endif  // CROARING_COMPILER_SUPPORTS_AVX512
        support = (has_avx2 ? ROARING_SUPPORTS_AVX2 : 0) |
                  (has_avx512 ? ROARING_SUPPORTS_AVX512 : 0);
    }
    return support;
}